

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

string * __thiscall
inja::Environment::render
          (string *__return_storage_ptr__,Environment *this,string_view input,json *data)

{
  Template local_a8;
  json *local_30;
  json *data_local;
  Environment *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (Environment *)input._M_len;
  local_30 = data;
  data_local = (json *)this;
  input_local._M_str = (char *)__return_storage_ptr__;
  parse(&local_a8,this,input);
  render(__return_storage_ptr__,this,&local_a8,local_30);
  Template::~Template(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string render(std::string_view input, const json& data) {
    return render(parse(input), data);
  }